

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

streamsize __thiscall
tcu::DebugOutStreambuf::xsputn(DebugOutStreambuf *this,char *s,streamsize count)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  lVar1 = 0;
  if (0 < count) {
    lVar1 = count;
  }
  for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    std::ostream::put((char)this + '@');
    if (s[lVar2] == '\n') {
      flushLine(this);
    }
  }
  return count;
}

Assistant:

std::streamsize DebugOutStreambuf::xsputn (const char* s, std::streamsize count)
{
	for (std::streamsize pos = 0; pos < count; pos++)
	{
		m_curLine.put(s[pos]);

		if (s[pos] == '\n')
			flushLine();
	}

	return count;
}